

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

void __thiscall rest_rpc::rpc_client::error_callback(rpc_client *this,error_code *ec)

{
  error_code __args;
  bool bVar1;
  error_category *in_RSI;
  long in_RDI;
  rpc_client *in_stack_ffffffffffffffe0;
  
  bVar1 = std::function::operator_cast_to_bool((function<void_(std::error_code)> *)0x1d66b3);
  if (bVar1) {
    in_stack_ffffffffffffffe0 = *(rpc_client **)in_RSI;
    __args._M_cat = in_RSI;
    __args._0_8_ = *(undefined8 *)(in_RSI + 8);
    std::function<void_(std::error_code)>::operator()
              ((function<void_(std::error_code)> *)in_stack_ffffffffffffffe0,__args);
  }
  if ((*(byte *)(in_RDI + 0x250) & 1) != 0) {
    async_reconnect(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void error_callback(const asio::error_code &ec) {
    if (err_cb_) {
      err_cb_(ec);
    }

    if (enable_reconnect_) {
      async_reconnect();
    }
  }